

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O2

logical pnga_comp_patch(Integer andim,Integer *alo,Integer *ahi,Integer bndim,Integer *blo,
                       Integer *bhi)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  Integer IVar4;
  
  lVar3 = bndim;
  if (bndim < andim) {
    do {
      IVar4 = bndim;
      if (andim <= lVar3) goto LAB_00116803;
      plVar1 = alo + lVar3;
      plVar2 = ahi + lVar3;
      lVar3 = lVar3 + 1;
    } while (*plVar1 == *plVar2);
  }
  else {
    IVar4 = andim;
    lVar3 = andim;
    if (andim < bndim) {
      do {
        if (bndim == lVar3) goto LAB_00116803;
        plVar1 = blo + lVar3;
        plVar2 = bhi + lVar3;
        lVar3 = lVar3 + 1;
      } while (*plVar1 == *plVar2);
    }
    else {
LAB_00116803:
      if (IVar4 < 1) {
        IVar4 = 0;
      }
      lVar3 = 0;
      do {
        if (IVar4 == lVar3) {
          return 1;
        }
      } while ((alo[lVar3] == blo[lVar3]) &&
              (plVar1 = ahi + lVar3, plVar2 = bhi + lVar3, lVar3 = lVar3 + 1, *plVar1 == *plVar2));
    }
  }
  return 0;
}

Assistant:

logical pnga_comp_patch(Integer andim, Integer *alo, Integer *ahi,
                          Integer bndim, Integer *blo, Integer *bhi)
{
    Integer i;
    Integer ndim;
    
    if(andim > bndim) {
        ndim = bndim;
        for(i=ndim; i<andim; i++)
            if(alo[i] != ahi[i]) return FALSE;
    }
    else if(andim < bndim) {
        ndim = andim;
        for(i=ndim; i<bndim; i++)
            if(blo[i] != bhi[i]) return FALSE;
    }
    else ndim = andim;
    
    for(i=0; i<ndim; i++)
        if((alo[i] != blo[i]) || (ahi[i] != bhi[i])) return FALSE;

    return TRUE; 
}